

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void blend_color_generic(int count,QT_FT_Span *spans,void *userData)

{
  QRgb QVar1;
  int cEnd;
  int priority;
  QThreadPool *pQVar2;
  ulong uVar3;
  QSpanData *in_RDX;
  int in_EDI;
  long in_FS_OFFSET;
  int cn;
  int i;
  int c;
  QThreadPool *threadPool;
  int segments;
  BPP bpp;
  bool solidFill;
  uint color;
  QSpanData *data;
  QSemaphore semaphore;
  Operator op;
  anon_class_208_6_629cd7f6 function;
  int iVar4;
  int iVar5;
  QColor *in_stack_fffffffffffffe20;
  QThreadPool *this;
  BPP cStart;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 uVar6;
  int in_stack_fffffffffffffe34;
  QSpanData *data_00;
  undefined1 *local_190;
  int local_188 [44];
  undefined1 local_d8 [8];
  byte local_d0;
  BPP local_cc;
  undefined1 auStack_c8 [184];
  QRgb local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  data_00 = in_RDX;
  memcpy(local_188,&DAT_00bfe0a0,0xb0);
  getOperator(data_00,(QT_FT_Span *)in_RDX,in_stack_fffffffffffffe34);
  QVar1 = QColor::rgba(in_stack_fffffffffffffe20);
  uVar6 = CONCAT13(local_188[0] == 3,(int3)in_stack_fffffffffffffe30);
  cStart = qPixelLayouts[in_RDX->rasterBuffer->format].bpp;
  memcpy(local_d8,&DAT_00bfe150,0xd0);
  local_d0 = (byte)((uint)uVar6 >> 0x18) & 1;
  local_cc = cStart;
  memcpy(auStack_c8,local_188,0xb0);
  cEnd = (in_EDI + 0x20) / 0x40;
  local_10 = QVar1;
  pQVar2 = QGuiApplicationPrivate::qtGuiThreadPool();
  if (((1 < cEnd) && (2 < (int)qPixelLayouts[in_RDX->rasterBuffer->format].bpp)) &&
     (pQVar2 != (QThreadPool *)0x0)) {
    this = pQVar2;
    QThread::currentThread();
    uVar3 = QThreadPool::contains((QThread *)pQVar2);
    if ((uVar3 & 1) == 0) {
      local_190 = &DAT_aaaaaaaaaaaaaaaa;
      QSemaphore::QSemaphore((QSemaphore *)&local_190,0);
      iVar5 = 0;
      for (iVar4 = 0; iVar4 < cEnd; iVar4 = iVar4 + 1) {
        priority = (in_EDI - iVar5) / (cEnd - iVar4);
        QThreadPool::
        start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4021:5),_true>
                  (this,(anon_class_24_4_b418dff8_for_o *)CONCAT44(iVar5,iVar4),priority);
        iVar5 = priority + iVar5;
      }
      QSemaphore::acquire((int)&local_190);
      QSemaphore::~QSemaphore((QSemaphore *)&local_190);
      goto LAB_00b4504a;
    }
  }
  blend_color_generic::anon_class_208_6_629cd7f6::operator()
            ((anon_class_208_6_629cd7f6 *)CONCAT44(QVar1,uVar6),cStart,cEnd);
LAB_00b4504a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_color_generic(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    const Operator op = getOperator(data, nullptr, 0);
    const uint color = data->solidColor.rgba();
    const bool solidFill = op.mode == QPainter::CompositionMode_Source;
    const QPixelLayout::BPP bpp = qPixelLayouts[data->rasterBuffer->format].bpp;

    auto function = [=] (int cStart, int cEnd) {
        alignas(16) Q_DECL_UNINITIALIZED uint buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            if (solidFill && bpp >= QPixelLayout::BPP8 && spans[c].coverage == 255 && length && op.destStore) {
                // If dest doesn't matter we don't need to bother with blending or converting all the identical pixels
                op.destStore(data->rasterBuffer, x, spans[c].y, &color, 1);
                spanfill_from_first(data->rasterBuffer, bpp, x, spans[c].y, length);
                length = 0;
            }

            while (length) {
                int l = qMin(BufferSize, length);
                uint *dest = op.destFetch(buffer, data->rasterBuffer, x, spans[c].y, l);
                op.funcSolid(dest, l, color, spans[c].coverage);
                if (op.destStore)
                    op.destStore(data->rasterBuffer, x, spans[c].y, dest, l);
                length -= l;
                x += l;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}